

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

bool ev3dev::button::process_all(void)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  iterator pvVar6;
  iterator pvVar7;
  array<bool,_6UL> changed;
  undefined2 in_stack_fffffffffffffff8;
  undefined1 in_stack_fffffffffffffffa;
  undefined1 in_stack_fffffffffffffffb;
  undefined1 in_stack_fffffffffffffffc;
  undefined1 in_stack_fffffffffffffffd;
  undefined1 in_stack_fffffffffffffffe;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar1 = process((button *)
                  CONCAT17(in_stack_ffffffffffffffff,
                           CONCAT16(in_stack_fffffffffffffffe,
                                    CONCAT15(in_stack_fffffffffffffffd,
                                             CONCAT14(in_stack_fffffffffffffffc,
                                                      CONCAT13(in_stack_fffffffffffffffb,
                                                               CONCAT12(in_stack_fffffffffffffffa,
                                                                        in_stack_fffffffffffffff8)))
                                            ))));
  uVar2 = process((button *)
                  CONCAT17(in_stack_ffffffffffffffff,
                           CONCAT16(in_stack_fffffffffffffffe,
                                    CONCAT15(in_stack_fffffffffffffffd,
                                             CONCAT14(in_stack_fffffffffffffffc,
                                                      CONCAT13(in_stack_fffffffffffffffb,
                                                               CONCAT12(uVar1,
                                                  in_stack_fffffffffffffff8)))))));
  uVar3 = process((button *)
                  CONCAT17(in_stack_ffffffffffffffff,
                           CONCAT16(in_stack_fffffffffffffffe,
                                    CONCAT15(in_stack_fffffffffffffffd,
                                             CONCAT14(in_stack_fffffffffffffffc,
                                                      CONCAT13(uVar2,CONCAT12(uVar1,
                                                  in_stack_fffffffffffffff8)))))));
  uVar4 = process((button *)
                  CONCAT17(in_stack_ffffffffffffffff,
                           CONCAT16(in_stack_fffffffffffffffe,
                                    CONCAT15(in_stack_fffffffffffffffd,
                                             CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(uVar1,
                                                  in_stack_fffffffffffffff8)))))));
  bVar5 = process((button *)
                  CONCAT17(in_stack_ffffffffffffffff,
                           CONCAT16(in_stack_fffffffffffffffe,
                                    CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(uVar1,
                                                  in_stack_fffffffffffffff8)))))));
  process((button *)
          CONCAT17(in_stack_ffffffffffffffff,
                   CONCAT16(bVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(uVar1,
                                                  in_stack_fffffffffffffff8)))))));
  pvVar6 = std::array<bool,_6UL>::begin((array<bool,_6UL> *)0x12c71a);
  pvVar7 = std::array<bool,_6UL>::end((array<bool,_6UL> *)0x12c729);
  bVar5 = std::any_of<bool*,ev3dev::button::process_all()::__0>(pvVar6,pvVar7);
  return bVar5;
}

Assistant:

bool button::process_all() {
    std::array<bool, 6> changed{{
        back. process(),
            left. process(),
            right.process(),
            up.   process(),
            down. process(),
            enter.process()
    }};
    return std::any_of(changed.begin(), changed.end(), [](bool c){ return c; });
}